

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipstats.cpp
# Opt level: O0

void __thiscall IPStatsRecord::IPStatsRecord(IPStatsRecord *this)

{
  IPStatsRecord *this_local;
  
  this->ipaddr_length = 0;
  this->query_volume = 0;
  this->arpa_count = 0;
  this->no_such_domain_queries = 0;
  this->no_such_domain_reserved = 0;
  this->no_such_domain_frequent = 0;
  this->no_such_domain_chromioids = 0;
  HyperLogLog::HyperLogLog(&this->tld_hyperlog);
  HyperLogLog::HyperLogLog(&this->sld_hyperlog);
  this->HashNext = (IPStatsRecord *)0x0;
  memset(this->ip_addr,0,0x10);
  memset(this->hourly_volume,0,0xc0);
  memset(this->daily_volume,0,0xf8);
  memset(this->tld_counts,0,0x40);
  memset(this->sld_counts,0,0x40);
  memset(this->name_parts,0,0x40);
  memset(this->rr_types,0,0x40);
  memset(this->locales,0,0x40);
  return;
}

Assistant:

IPStatsRecord::IPStatsRecord() :
    ipaddr_length(0),
    query_volume(0),
    arpa_count(0),
    no_such_domain_queries(0),
    no_such_domain_reserved(0),
    no_such_domain_frequent(0),
    no_such_domain_chromioids(0),
    HashNext(NULL)
{
    memset(ip_addr, 0, sizeof(ip_addr));
    memset(hourly_volume, 0, sizeof(hourly_volume));
    memset(daily_volume, 0, sizeof(daily_volume));
    memset(tld_counts, 0, sizeof(tld_counts));
    memset(sld_counts, 0, sizeof(sld_counts));
    memset(name_parts, 0, sizeof(name_parts));
    memset(rr_types, 0, sizeof(rr_types));
    memset(locales, 0, sizeof(locales));
}